

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O0

void __thiscall SimpleLoggerMgr::sleepFlusher(SimpleLoggerMgr *this,size_t ms)

{
  condition_variable *in_RSI;
  mutex_type *in_RDI;
  unique_lock<std::mutex> l;
  unique_lock<std::mutex> *in_stack_ffffffffffffffc0;
  unique_lock<std::mutex> *this_00;
  duration<long,std::ratio<1l,1000l>> local_28 [8];
  duration<long,_std::ratio<1L,_1000L>_> *in_stack_ffffffffffffffe0;
  unique_lock<std::mutex> *in_stack_ffffffffffffffe8;
  
  std::unique_lock<std::mutex>::unique_lock(in_stack_ffffffffffffffc0,in_RDI);
  this_00 = (unique_lock<std::mutex> *)&in_RDI[6].super___mutex_base._M_mutex.__data.__list.__next;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<unsigned_long,void>
            (local_28,(unsigned_long *)&stack0xfffffffffffffff0);
  std::condition_variable::wait_for<long,std::ratio<1l,1000l>>
            (in_RSI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  std::unique_lock<std::mutex>::~unique_lock(this_00);
  return;
}

Assistant:

void SimpleLoggerMgr::sleepFlusher(size_t ms) {
    std::unique_lock<std::mutex> l(cvFlusherLock);
    cvFlusher.wait_for(l, std::chrono::milliseconds(ms));
}